

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O0

void __thiscall
ScriptCompression::Ser<DataStream>(ScriptCompression *this,DataStream *s,CScript *script)

{
  long lVar1;
  bool bVar2;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  uint nSize;
  CompressedScript compr;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff38;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff40;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector(in_stack_ffffffffffffff38);
  bVar2 = CompressScript((CScript *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (bVar2) {
    Span<unsigned_char>::Span<prevector<33u,unsigned_char,unsigned_int,int>>
              ((Span<unsigned_char> *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    DataStream::operator<<
              ((DataStream *)in_stack_ffffffffffffff48,
               (Span<unsigned_char> *)in_stack_ffffffffffffff40);
  }
  else {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff48);
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)in_stack_ffffffffffffff40);
    DataStream::operator<<
              ((DataStream *)in_stack_ffffffffffffff48,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)in_stack_ffffffffffffff40)
    ;
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_RSI,(CScript *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    DataStream::operator<<(in_RSI,(Span<const_unsigned_char> *)in_stack_ffffffffffffff40);
  }
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }